

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall google::protobuf::compiler::Parser::SkipRestOfBlock(Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  long lVar3;
  string_view text;
  string_view text_00;
  
  lVar3 = 1;
  do {
    TVar1 = (this->input_->current_).type;
    if (TVar1 == TYPE_SYMBOL) {
      text._M_str = "}";
      text._M_len = 1;
      bVar2 = TryConsumeEndOfDeclaration(this,text,(LocationRecorder *)0x0);
      if (bVar2) {
        lVar3 = lVar3 + -1;
        if (lVar3 == 0) {
          return;
        }
      }
      else {
        text_00._M_str = "{";
        text_00._M_len = 1;
        bVar2 = TryConsume(this,text_00);
        lVar3 = lVar3 + (ulong)bVar2;
      }
    }
    else if (TVar1 == TYPE_END) {
      return;
    }
    io::Tokenizer::Next(this->input_);
  } while( true );
}

Assistant:

void Parser::SkipRestOfBlock() {
  size_t block_count = 1;
  while (true) {
    if (AtEnd()) {
      return;
    } else if (LookingAtType(io::Tokenizer::TYPE_SYMBOL)) {
      if (TryConsumeEndOfDeclaration("}", nullptr)) {
        if (--block_count == 0) break;
      } else if (TryConsume("{")) {
        ++block_count;
      }
    }
    input_->Next();
  }
}